

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Updater.cpp
# Opt level: O3

void __thiscall Updater::onReply(Updater *this,QNetworkReply *reply)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QJsonObject platform;
  QJsonDocument document;
  QUrl redirect;
  QJsonObject updates;
  QString local_b8;
  QArrayData *local_98;
  char16_t *pcStack_90;
  QArrayData **local_88;
  QArrayData *local_78;
  char16_t *pcStack_70;
  qsizetype local_68;
  QJsonObject local_60 [8];
  QArrayData *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  undefined1 local_38 [24];
  
  QNetworkReply::attribute((Attribute)&local_98);
  QVariant::toUrl();
  QVariant::~QVariant((QVariant *)&local_98);
  cVar4 = QUrl::isEmpty();
  if (cVar4 == '\0') {
    QUrl::toString(&local_98,local_38 + 8,0);
    QString::operator=(&this->m_url,(QString *)&local_98);
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,2,8);
      }
    }
    checkForUpdates(this);
  }
  else {
    iVar6 = QNetworkReply::error();
    if (iVar6 == 0) {
      if (this->m_customAppcast != true) {
        QIODevice::readAll();
        QJsonDocument::fromJson((QByteArray *)local_38,(QJsonParseError *)&local_98);
        if (local_98 != (QArrayData *)0x0) {
          LOCK();
          (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_98,1,8);
          }
        }
        cVar4 = QJsonDocument::isNull();
        if (cVar4 == '\0') {
          QJsonDocument::object();
          QVar7.m_data = (storage_type *)0x7;
          QVar7.m_size = (qsizetype)&local_98;
          QString::fromUtf8(QVar7);
          local_78 = local_98;
          pcStack_70 = pcStack_90;
          local_68 = (qsizetype)local_88;
          QJsonObject::value((QString *)&local_b8);
          QJsonValue::toObject();
          QJsonValue::~QJsonValue((QJsonValue *)&local_b8);
          if (local_78 != (QArrayData *)0x0) {
            LOCK();
            (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_78,2,8);
            }
          }
          QJsonObject::~QJsonObject((QJsonObject *)&local_58);
          local_b8.d.d = (this->m_platform).d.d;
          local_b8.d.ptr = (this->m_platform).d.ptr;
          local_b8.d.size = (this->m_platform).d.size;
          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&((local_b8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((local_b8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QJsonObject::value((QString *)&local_98);
          QJsonValue::toObject();
          QJsonValue::~QJsonValue((QJsonValue *)&local_98);
          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
            }
          }
          QVar8.m_data = (storage_type *)0x8;
          QVar8.m_size = (qsizetype)&local_98;
          QString::fromUtf8(QVar8);
          local_58 = local_98;
          pcStack_50 = pcStack_90;
          local_48 = (qsizetype)local_88;
          QJsonObject::value((QString *)&local_78);
          QJsonValue::toString();
          pQVar1 = &((this->m_openUrl).d.d)->super_QArrayData;
          pcVar2 = (this->m_openUrl).d.ptr;
          (this->m_openUrl).d.d = local_b8.d.d;
          (this->m_openUrl).d.ptr = local_b8.d.ptr;
          qVar3 = (this->m_openUrl).d.size;
          (this->m_openUrl).d.size = local_b8.d.size;
          local_b8.d.d = (Data *)pQVar1;
          local_b8.d.ptr = pcVar2;
          local_b8.d.size = qVar3;
          if (pQVar1 != (QArrayData *)0x0) {
            LOCK();
            (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar1,2,8);
            }
          }
          QJsonValue::~QJsonValue((QJsonValue *)&local_78);
          if (local_58 != (QArrayData *)0x0) {
            LOCK();
            (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_58,2,8);
            }
          }
          QVar9.m_data = (storage_type *)0x9;
          QVar9.m_size = (qsizetype)&local_98;
          QString::fromUtf8(QVar9);
          local_58 = local_98;
          pcStack_50 = pcStack_90;
          local_48 = (qsizetype)local_88;
          QJsonObject::value((QString *)&local_78);
          QJsonValue::toString();
          pQVar1 = &((this->m_changelog).d.d)->super_QArrayData;
          pcVar2 = (this->m_changelog).d.ptr;
          (this->m_changelog).d.d = local_b8.d.d;
          (this->m_changelog).d.ptr = local_b8.d.ptr;
          qVar3 = (this->m_changelog).d.size;
          (this->m_changelog).d.size = local_b8.d.size;
          local_b8.d.d = (Data *)pQVar1;
          local_b8.d.ptr = pcVar2;
          local_b8.d.size = qVar3;
          if (pQVar1 != (QArrayData *)0x0) {
            LOCK();
            (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar1,2,8);
            }
          }
          QJsonValue::~QJsonValue((QJsonValue *)&local_78);
          if (local_58 != (QArrayData *)0x0) {
            LOCK();
            (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_58,2,8);
            }
          }
          QVar10.m_data = (storage_type *)0xc;
          QVar10.m_size = (qsizetype)&local_98;
          QString::fromUtf8(QVar10);
          local_58 = local_98;
          pcStack_50 = pcStack_90;
          local_48 = (qsizetype)local_88;
          QJsonObject::value((QString *)&local_78);
          QJsonValue::toString();
          pQVar1 = &((this->m_downloadUrl).d.d)->super_QArrayData;
          pcVar2 = (this->m_downloadUrl).d.ptr;
          (this->m_downloadUrl).d.d = local_b8.d.d;
          (this->m_downloadUrl).d.ptr = local_b8.d.ptr;
          qVar3 = (this->m_downloadUrl).d.size;
          (this->m_downloadUrl).d.size = local_b8.d.size;
          local_b8.d.d = (Data *)pQVar1;
          local_b8.d.ptr = pcVar2;
          local_b8.d.size = qVar3;
          if (pQVar1 != (QArrayData *)0x0) {
            LOCK();
            (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar1,2,8);
            }
          }
          QJsonValue::~QJsonValue((QJsonValue *)&local_78);
          if (local_58 != (QArrayData *)0x0) {
            LOCK();
            (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_58,2,8);
            }
          }
          QVar11.m_data = (storage_type *)0xe;
          QVar11.m_size = (qsizetype)&local_98;
          QString::fromUtf8(QVar11);
          local_58 = local_98;
          pcStack_50 = pcStack_90;
          local_48 = (qsizetype)local_88;
          QJsonObject::value((QString *)&local_78);
          QJsonValue::toString();
          pQVar1 = &((this->m_latestVersion).d.d)->super_QArrayData;
          pcVar2 = (this->m_latestVersion).d.ptr;
          (this->m_latestVersion).d.d = local_b8.d.d;
          (this->m_latestVersion).d.ptr = local_b8.d.ptr;
          qVar3 = (this->m_latestVersion).d.size;
          (this->m_latestVersion).d.size = local_b8.d.size;
          local_b8.d.d = (Data *)pQVar1;
          local_b8.d.ptr = pcVar2;
          local_b8.d.size = qVar3;
          if (pQVar1 != (QArrayData *)0x0) {
            LOCK();
            (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar1,2,8);
            }
          }
          QJsonValue::~QJsonValue((QJsonValue *)&local_78);
          if (local_58 != (QArrayData *)0x0) {
            LOCK();
            (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_58,2,8);
            }
          }
          QVar12.m_data = (storage_type *)0x10;
          QVar12.m_size = (qsizetype)&local_98;
          QString::fromUtf8(QVar12);
          local_b8.d.d = (Data *)local_98;
          local_b8.d.ptr = pcStack_90;
          local_b8.d.size = (qsizetype)local_88;
          cVar4 = QJsonObject::contains((QString *)local_60);
          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
            }
          }
          if (cVar4 != '\0') {
            QVar13.m_data = (storage_type *)0x10;
            QVar13.m_size = (qsizetype)&local_98;
            QString::fromUtf8(QVar13);
            local_78 = local_98;
            pcStack_70 = pcStack_90;
            local_68 = (qsizetype)local_88;
            QJsonObject::value((QString *)&local_b8);
            bVar5 = (bool)QJsonValue::toBool(SUB81(&local_b8,0));
            this->m_mandatoryUpdate = bVar5;
            QJsonValue::~QJsonValue((QJsonValue *)&local_b8);
            if (local_78 != (QArrayData *)0x0) {
              LOCK();
              (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_78,2,8);
              }
            }
          }
          local_98 = &((this->m_latestVersion).d.d)->super_QArrayData;
          pcStack_90 = (this->m_latestVersion).d.ptr;
          local_88 = (QArrayData **)(this->m_latestVersion).d.size;
          if (local_98 != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&local_98->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)&local_98->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_b8.d.d = (this->m_moduleVersion).d.d;
          local_b8.d.ptr = (this->m_moduleVersion).d.ptr;
          local_b8.d.size = (this->m_moduleVersion).d.size;
          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&((local_b8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((local_b8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          bVar5 = QSimpleUpdater::compareVersions((QString *)&local_98,&local_b8);
          setUpdateAvailable(this,bVar5);
          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
            }
          }
          if (local_98 != (QArrayData *)0x0) {
            LOCK();
            (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_98,2,8);
            }
          }
          local_98 = &((this->m_url).d.d)->super_QArrayData;
          pcStack_90 = (this->m_url).d.ptr;
          local_88 = (QArrayData **)(this->m_url).d.size;
          if (local_98 != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&local_98->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)&local_98->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_b8.d.d = (Data *)0x0;
          local_b8.d.ptr = (char16_t *)&local_98;
          QMetaObject::activate(&this->super_QObject,&staticMetaObject,0,(void **)&local_b8);
          if (local_98 != (QArrayData *)0x0) {
            LOCK();
            (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_98,2,8);
            }
          }
          QJsonObject::~QJsonObject(local_60);
          QJsonObject::~QJsonObject((QJsonObject *)(local_38 + 0x10));
        }
        else {
          setUpdateAvailable(this,false);
          local_98 = &((this->m_url).d.d)->super_QArrayData;
          pcStack_90 = (this->m_url).d.ptr;
          local_88 = (QArrayData **)(this->m_url).d.size;
          if (local_98 != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&local_98->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)&local_98->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_b8.d.d = (Data *)0x0;
          local_b8.d.ptr = (char16_t *)&local_98;
          QMetaObject::activate(&this->super_QObject,&staticMetaObject,0,(void **)&local_b8);
          if (local_98 != (QArrayData *)0x0) {
            LOCK();
            (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_98,2,8);
            }
          }
        }
        QJsonDocument::~QJsonDocument((QJsonDocument *)local_38);
        goto LAB_00110c13;
      }
      local_b8.d.d = (this->m_url).d.d;
      local_b8.d.ptr = (this->m_url).d.ptr;
      local_b8.d.size = (this->m_url).d.size;
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_b8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_b8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QIODevice::readAll();
      local_98 = (QArrayData *)0x0;
      pcStack_90 = (char16_t *)&local_b8;
      local_88 = &local_78;
      QMetaObject::activate(&this->super_QObject,&staticMetaObject,2,(void **)&local_98);
      if (local_78 != (QArrayData *)0x0) {
        LOCK();
        (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_78,1,8);
        }
      }
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
        }
      }
      local_98 = &((this->m_url).d.d)->super_QArrayData;
      pcStack_90 = (this->m_url).d.ptr;
      local_88 = (QArrayData **)(this->m_url).d.size;
      if (local_98 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&local_98->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&local_98->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_b8.d.d = (Data *)0x0;
      local_b8.d.ptr = (char16_t *)&local_98;
      QMetaObject::activate(&this->super_QObject,&staticMetaObject,0,(void **)&local_b8);
    }
    else {
      setUpdateAvailable(this,false);
      local_98 = &((this->m_url).d.d)->super_QArrayData;
      pcStack_90 = (this->m_url).d.ptr;
      local_88 = (QArrayData **)(this->m_url).d.size;
      if (local_98 != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&local_98->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&local_98->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_b8.d.d = (Data *)0x0;
      local_b8.d.ptr = (char16_t *)&local_98;
      QMetaObject::activate(&this->super_QObject,&staticMetaObject,0,(void **)&local_b8);
    }
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,2,8);
      }
    }
  }
LAB_00110c13:
  QUrl::~QUrl((QUrl *)(local_38 + 8));
  return;
}

Assistant:

void Updater::onReply(QNetworkReply *reply)
{
   /* Check if we need to redirect */
   QUrl redirect = reply->attribute(QNetworkRequest::RedirectionTargetAttribute).toUrl();
   if (!redirect.isEmpty())
   {
      setUrl(redirect.toString());
      checkForUpdates();
      return;
   }

   /* There was a network error */
   if (reply->error() != QNetworkReply::NoError)
   {
      setUpdateAvailable(false);
      emit checkingFinished(url());
      return;
   }

   /* The application wants to interpret the appcast by itself */
   if (customAppcast())
   {
      emit appcastDownloaded(url(), reply->readAll());
      emit checkingFinished(url());
      return;
   }

   /* Try to create a JSON document from downloaded data */
   QJsonDocument document = QJsonDocument::fromJson(reply->readAll());

   /* JSON is invalid */
   if (document.isNull())
   {
      setUpdateAvailable(false);
      emit checkingFinished(url());
      return;
   }

   /* Get the platform information */
   QJsonObject updates = document.object().value("updates").toObject();
   QJsonObject platform = updates.value(platformKey()).toObject();

   /* Get update information */
   m_openUrl = platform.value("open-url").toString();
   m_changelog = platform.value("changelog").toString();
   m_downloadUrl = platform.value("download-url").toString();
   m_latestVersion = platform.value("latest-version").toString();
   if (platform.contains("mandatory-update"))
      m_mandatoryUpdate = platform.value("mandatory-update").toBool();

   /* Compare latest and current version */
   setUpdateAvailable(compare(latestVersion(), moduleVersion()));
   emit checkingFinished(url());
}